

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giftogd2.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  
  if (argc == 5) {
    pFVar3 = fopen(argv[1],"rb");
    if (pFVar3 == (FILE *)0x0) goto LAB_0010131c;
    lVar4 = gdImageCreateFromGif(pFVar3);
    fclose(pFVar3);
    if (lVar4 != 0) {
      pFVar3 = fopen(argv[2],"wb");
      if (pFVar3 != (FILE *)0x0) {
        iVar1 = atoi(argv[3]);
        iVar2 = atoi(argv[4]);
        gdImageGd2(lVar4,pFVar3,iVar1,iVar2);
        fclose(pFVar3);
        gdImageDestroy(lVar4);
        return 0;
      }
      goto LAB_00101326;
    }
  }
  else {
    main_cold_1();
LAB_0010131c:
    main_cold_4();
  }
  main_cold_3();
LAB_00101326:
  main_cold_2();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im;
	FILE *in, *out;
	int	cs, fmt;

	if (argc != 5) {
		fprintf(stderr, "Usage: giftogd2 filename.gif filename.gd2 cs fmt\n");
		fprintf(stderr, "       where cs is the chunk size\n");
		fprintf(stderr, "	fmt is 1 for raw, 2 for compressed\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im = gdImageCreateFromGif(in);
	fclose(in);
	if (!im) {
		fprintf(stderr, "Input is not in GIF format!\n");
		exit(1);
	}
	out = fopen(argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy(im);
		exit(1);
	}
	cs = atoi(argv[3]);
	fmt = atoi(argv[4]);
	gdImageGd2(im, out, cs, fmt);
	fclose(out);
	gdImageDestroy(im);

	return 0;
}